

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigSplit.c
# Opt level: O1

Vec_Ptr_t * Aig_ManVecRandSubset(Vec_Ptr_t *vVec,int nVars)

{
  long lVar1;
  int iVar2;
  long lVar3;
  void **ppvVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Vec_Ptr_t *pVVar8;
  void **__dest;
  void **ppvVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  iVar10 = vVec->nSize;
  pVVar8->nSize = iVar10;
  iVar2 = vVec->nCap;
  pVVar8->nCap = iVar2;
  if ((long)iVar2 == 0) {
    __dest = (void **)0x0;
  }
  else {
    __dest = (void **)malloc((long)iVar2 << 3);
  }
  pVVar8->pArray = __dest;
  memcpy(__dest,vVec->pArray,(long)iVar10 << 3);
  uVar12 = pVVar8->nSize;
  uVar6 = uVar12;
  while( true ) {
    if ((int)uVar12 <= nVars) {
      pVVar8->nSize = uVar6;
      return pVVar8;
    }
    uVar6 = Aig_ManRandom(0);
    iVar10 = (int)((ulong)uVar6 % (ulong)uVar12);
    if ((iVar10 < 0) || ((int)uVar12 <= iVar10)) break;
    lVar11 = (ulong)uVar12 + 1;
    ppvVar4 = __dest + uVar12;
    uVar5 = uVar12;
    do {
      uVar7 = uVar5;
      ppvVar9 = ppvVar4;
      if ((int)lVar11 + -1 < 1) {
        pVVar8->nSize = uVar12;
        __assert_fail("i >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x2f6,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
      }
      lVar1 = lVar11 + -1;
      lVar3 = lVar11 + -2;
      lVar11 = lVar1;
      ppvVar4 = ppvVar9 + -1;
      uVar5 = uVar7 - 1;
    } while (__dest[lVar3] != __dest[(ulong)uVar6 % (ulong)uVar12]);
    uVar6 = (uint)lVar1;
    while ((int)uVar6 < (int)uVar12) {
      ppvVar9[-1] = *ppvVar9;
      ppvVar9 = ppvVar9 + 1;
      uVar7 = uVar7 + 1;
      uVar6 = uVar7;
    }
    uVar12 = uVar12 - 1;
    uVar6 = nVars;
  }
  pVVar8->nSize = uVar12;
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Vec_Ptr_t * Aig_ManVecRandSubset( Vec_Ptr_t * vVec, int nVars )
{
    Vec_Ptr_t * vRes;
    void * pEntry;
    unsigned Rand; 
    vRes = Vec_PtrDup(vVec);
    while ( Vec_PtrSize(vRes) > nVars )
    {
        Rand   = Aig_ManRandom( 0 );
        pEntry = Vec_PtrEntry( vRes, Rand % Vec_PtrSize(vRes) );
        Vec_PtrRemove( vRes, pEntry );
    }
    return vRes;
}